

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<LibrarySearchPath>::emplace<LibrarySearchPath_const&>
          (QGenericArrayOps<LibrarySearchPath> *this,qsizetype i,LibrarySearchPath *args)

{
  qsizetype *pqVar1;
  LibrarySearchPath **ppLVar2;
  Data *pDVar3;
  long lVar4;
  LibrarySearchPath *pLVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  Data *pDVar9;
  char16_t *pcVar10;
  qsizetype qVar11;
  long in_FS_OFFSET;
  bool bVar12;
  LibrarySearchPath tmp;
  Inserter local_b8;
  LibrarySearchPath local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<LibrarySearchPath>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0025df1a:
    local_68.super_QMakeLocalFileName.real_name.d.d = (args->super_QMakeLocalFileName).real_name.d.d
    ;
    local_68.super_QMakeLocalFileName.real_name.d.ptr =
         (args->super_QMakeLocalFileName).real_name.d.ptr;
    local_68.super_QMakeLocalFileName.real_name.d.size =
         (args->super_QMakeLocalFileName).real_name.d.size;
    if (&(local_68.super_QMakeLocalFileName.real_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_68.super_QMakeLocalFileName.real_name.d.d)->super_QArrayData).ref_)->
      ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)
            &((local_68.super_QMakeLocalFileName.real_name.d.d)->super_QArrayData).ref_)->ref_).
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_68.super_QMakeLocalFileName.local_name.d.d =
         (args->super_QMakeLocalFileName).local_name.d.d;
    local_68.super_QMakeLocalFileName.local_name.d.ptr =
         (args->super_QMakeLocalFileName).local_name.d.ptr;
    local_68.super_QMakeLocalFileName.local_name.d.size =
         (args->super_QMakeLocalFileName).local_name.d.size;
    if (&(local_68.super_QMakeLocalFileName.local_name.d.d)->super_QArrayData != (QArrayData *)0x0)
    {
      LOCK();
      (((QArrayData *)&((local_68.super_QMakeLocalFileName.local_name.d.d)->super_QArrayData).ref_)
      ->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)
            &((local_68.super_QMakeLocalFileName.local_name.d.d)->super_QArrayData).ref_)->ref_).
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_68._49_7_ = 0xaaaaaaaaaaaaaa;
    local_68._default = args->_default;
    bVar12 = (this->super_QArrayDataPointer<LibrarySearchPath>).size != 0;
    QArrayDataPointer<LibrarySearchPath>::detachAndGrow
              (&this->super_QArrayDataPointer<LibrarySearchPath>,(uint)(i == 0 && bVar12),1,
               (LibrarySearchPath **)0x0,(QArrayDataPointer<LibrarySearchPath> *)0x0);
    qVar11 = local_68.super_QMakeLocalFileName.local_name.d.size;
    pcVar10 = local_68.super_QMakeLocalFileName.local_name.d.ptr;
    pDVar9 = local_68.super_QMakeLocalFileName.local_name.d.d;
    qVar8 = local_68.super_QMakeLocalFileName.real_name.d.size;
    pcVar7 = local_68.super_QMakeLocalFileName.real_name.d.ptr;
    pDVar6 = local_68.super_QMakeLocalFileName.real_name.d.d;
    if (i == 0 && bVar12) {
      pLVar5 = (this->super_QArrayDataPointer<LibrarySearchPath>).ptr;
      local_68.super_QMakeLocalFileName.real_name.d.d = (Data *)0x0;
      pLVar5[-1].super_QMakeLocalFileName.real_name.d.d = pDVar6;
      local_68.super_QMakeLocalFileName.real_name.d.ptr = (char16_t *)0x0;
      pLVar5[-1].super_QMakeLocalFileName.real_name.d.ptr = pcVar7;
      local_68.super_QMakeLocalFileName.real_name.d.size = 0;
      pLVar5[-1].super_QMakeLocalFileName.real_name.d.size = qVar8;
      local_68.super_QMakeLocalFileName.local_name.d.d = (Data *)0x0;
      pLVar5[-1].super_QMakeLocalFileName.local_name.d.d = pDVar9;
      local_68.super_QMakeLocalFileName.local_name.d.ptr = (char16_t *)0x0;
      pLVar5[-1].super_QMakeLocalFileName.local_name.d.ptr = pcVar10;
      local_68.super_QMakeLocalFileName.local_name.d.size = 0;
      pLVar5[-1].super_QMakeLocalFileName.local_name.d.size = qVar11;
      pLVar5[-1]._default = local_68._default;
      (this->super_QArrayDataPointer<LibrarySearchPath>).ptr = pLVar5 + -1;
      pqVar1 = &(this->super_QArrayDataPointer<LibrarySearchPath>).size;
      *pqVar1 = *pqVar1 + 1;
    }
    else {
      local_b8.sourceCopyConstruct = 0;
      local_b8.nSource = 0;
      local_b8.move = 0;
      local_b8.sourceCopyAssign = 0;
      local_b8.end = (LibrarySearchPath *)0x0;
      local_b8.last = (LibrarySearchPath *)0x0;
      local_b8.where = (LibrarySearchPath *)0x0;
      local_b8.begin = (this->super_QArrayDataPointer<LibrarySearchPath>).ptr;
      local_b8.size = (this->super_QArrayDataPointer<LibrarySearchPath>).size;
      local_b8.data = &this->super_QArrayDataPointer<LibrarySearchPath>;
      Inserter::insertOne(&local_b8,i,&local_68);
      (local_b8.data)->ptr = local_b8.begin;
      (local_b8.data)->size = local_b8.size;
    }
    if (&(local_68.super_QMakeLocalFileName.local_name.d.d)->super_QArrayData != (QArrayData *)0x0)
    {
      LOCK();
      ((local_68.super_QMakeLocalFileName.local_name.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_68.super_QMakeLocalFileName.local_name.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.super_QMakeLocalFileName.local_name.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate
                  (&(local_68.super_QMakeLocalFileName.local_name.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.super_QMakeLocalFileName.real_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.super_QMakeLocalFileName.real_name.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_68.super_QMakeLocalFileName.real_name.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.super_QMakeLocalFileName.real_name.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate
                  (&(local_68.super_QMakeLocalFileName.real_name.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<LibrarySearchPath>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QArrayDataPointer<LibrarySearchPath>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        0x6db6db6db6db6db7)) {
      pLVar5 = (this->super_QArrayDataPointer<LibrarySearchPath>).ptr;
      pDVar6 = (args->super_QMakeLocalFileName).real_name.d.d;
      pLVar5[lVar4].super_QMakeLocalFileName.real_name.d.d = pDVar6;
      pLVar5[lVar4].super_QMakeLocalFileName.real_name.d.ptr =
           (args->super_QMakeLocalFileName).real_name.d.ptr;
      pLVar5[lVar4].super_QMakeLocalFileName.real_name.d.size =
           (args->super_QMakeLocalFileName).real_name.d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar6->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      pDVar6 = (args->super_QMakeLocalFileName).local_name.d.d;
      pLVar5[lVar4].super_QMakeLocalFileName.local_name.d.d = pDVar6;
      pLVar5[lVar4].super_QMakeLocalFileName.local_name.d.ptr =
           (args->super_QMakeLocalFileName).local_name.d.ptr;
      pLVar5[lVar4].super_QMakeLocalFileName.local_name.d.size =
           (args->super_QMakeLocalFileName).local_name.d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pLVar5[lVar4]._default = args->_default;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((LibrarySearchPath *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<LibrarySearchPath>).ptr)) goto LAB_0025df1a;
      pLVar5 = (this->super_QArrayDataPointer<LibrarySearchPath>).ptr;
      pDVar6 = (args->super_QMakeLocalFileName).real_name.d.d;
      pLVar5[-1].super_QMakeLocalFileName.real_name.d.d = pDVar6;
      pLVar5[-1].super_QMakeLocalFileName.real_name.d.ptr =
           (args->super_QMakeLocalFileName).real_name.d.ptr;
      pLVar5[-1].super_QMakeLocalFileName.real_name.d.size =
           (args->super_QMakeLocalFileName).real_name.d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar6->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      pDVar6 = (args->super_QMakeLocalFileName).local_name.d.d;
      pLVar5[-1].super_QMakeLocalFileName.local_name.d.d = pDVar6;
      pLVar5[-1].super_QMakeLocalFileName.local_name.d.ptr =
           (args->super_QMakeLocalFileName).local_name.d.ptr;
      pLVar5[-1].super_QMakeLocalFileName.local_name.d.size =
           (args->super_QMakeLocalFileName).local_name.d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pLVar5[-1]._default = args->_default;
      ppLVar2 = &(this->super_QArrayDataPointer<LibrarySearchPath>).ptr;
      *ppLVar2 = *ppLVar2 + -1;
    }
    pqVar1 = &(this->super_QArrayDataPointer<LibrarySearchPath>).size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }